

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::
ConstructMessage<std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          unsigned_long params_2,unsigned_long params_3)

{
  pointer pcVar1;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  unsigned_long in_stack_ffffffffffffff70;
  undefined1 local_88 [32];
  undefined1 local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_68._16_8_ = 0;
  local_88._0_8_ = local_88 + 0x10;
  pcVar1 = (msg->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar1,pcVar1 + msg->_M_string_length);
  pcVar1 = (params->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_68 + 0x18),pcVar1,pcVar1 + params->_M_string_length);
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
            (__return_storage_ptr__,this,(string *)local_68,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_68 + 0x18),params_1,params_2,in_stack_ffffffffffffff70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_);
  }
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          local_68);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}